

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffgload.c
# Opt level: O1

void cff_free_glyph_data(TT_Face face,FT_Byte **pointer,FT_ULong length)

{
  FT_Incremental_InterfaceRec *pFVar1;
  void *pvVar2;
  FT_Data data;
  FT_Data local_10;
  
  local_10.length = (FT_Int)length;
  pFVar1 = ((face->root).internal)->incremental_interface;
  if (pFVar1 != (FT_Incremental_InterfaceRec *)0x0) {
    local_10.pointer = *pointer;
    (*pFVar1->funcs->free_glyph_data)(pFVar1->object,&local_10);
    return;
  }
  pvVar2 = (face->extra).data;
  if (*(long *)((long)pvVar2 + 0x570) != 0) {
    return;
  }
  FT_Stream_ReleaseFrame(*(FT_Stream *)((long)pvVar2 + 0x538),pointer);
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cff_free_glyph_data( TT_Face    face,
                       FT_Byte**  pointer,
                       FT_ULong   length )
  {
#ifndef FT_CONFIG_OPTION_INCREMENTAL
    FT_UNUSED( length );
#endif

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    /* For incremental fonts get the character data using the */
    /* callback function.                                     */
    if ( face->root.internal->incremental_interface )
    {
      FT_Data  data;


      data.pointer = *pointer;
      data.length  = (FT_Int)length;

      face->root.internal->incremental_interface->funcs->free_glyph_data(
        face->root.internal->incremental_interface->object, &data );
    }
    else
#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    {
      CFF_Font  cff = (CFF_Font)(face->extra.data);


      cff_index_forget_element( &cff->charstrings_index, pointer );
    }
  }